

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

clockbounds_t * tchecker::clockbounds::compute_clockbounds(system_t *system)

{
  pointer psVar1;
  pointer psVar2;
  clockbounds_t *this;
  size_t sVar3;
  
  this = (clockbounds_t *)operator_new(0x40);
  psVar1 = *(pointer *)
            ((long)&(system->super_system_t).super_system_t.super_locs_t._locs.
                    super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  psVar2 = (system->super_system_t).super_system_t.super_locs_t._locs.
           super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(system->super_system_t).super_system_t.super_clocks_t._clock_variables.
                     super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._flattened_variables);
  clockbounds_t::clockbounds_t
            (this,(loc_id_t)((ulong)((long)psVar1 - (long)psVar2) >> 4),(clock_id_t)sVar3);
  compute_clockbounds(system,this);
  return this;
}

Assistant:

tchecker::clockbounds::clockbounds_t * compute_clockbounds(tchecker::ta::system_t const & system)
{
  tchecker::clockbounds::clockbounds_t * clockbounds = nullptr;
  try {
    clockbounds = new tchecker::clockbounds::clockbounds_t{
        static_cast<tchecker::loc_id_t>(system.locations_count()),
        static_cast<tchecker::clock_id_t>(system.clocks_count(tchecker::VK_FLATTENED))};

    tchecker::clockbounds::compute_clockbounds(system, *clockbounds);

    return clockbounds;
  }
  catch (...) {
    delete clockbounds;
    throw;
  }
}